

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi_load(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  uchar *result;
  FILE *f;
  int in_stack_0000009c;
  int *in_stack_000000a0;
  int *in_stack_000000a8;
  int *in_stack_000000b0;
  FILE *in_stack_000000b8;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  stbi_uc *local_8;
  
  __stream = (FILE *)stbi__fopen(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (__stream == (FILE *)0x0) {
    stbi__err("can\'t fopen");
    local_8 = (stbi_uc *)0x0;
  }
  else {
    local_8 = stbi_load_from_file(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                                  in_stack_000000a0,in_stack_0000009c);
    fclose(__stream);
  }
  return local_8;
}

Assistant:

STBIDEF stbi_uc *stbi_load(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   FILE *f = stbi__fopen(filename, "rb");
   unsigned char *result;
   if (!f) return stbi__errpuc("can't fopen", "Unable to open file");
   result = stbi_load_from_file(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}